

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O2

bool __thiscall
mp::internal::TextReader<fmt::Locale>::DoReadOptionalInt<short>
          (TextReader<fmt::Locale> *this,short *value)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  ulong in_RAX;
  short sVar4;
  UInt result;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  SkipSpace(this);
  pcVar2 = (this->super_ReaderBase).ptr_;
  cVar1 = *pcVar2;
  if ((cVar1 == '-') || (cVar1 == '+')) {
    (this->super_ReaderBase).ptr_ = pcVar2 + 1;
  }
  uStack_28 = uStack_28 & 0xffffffffffff;
  bVar3 = ReadIntWithoutSign<unsigned_short>(this,(unsigned_short *)((long)&uStack_28 + 6));
  if (bVar3) {
    if (((long)uStack_28 < 0) && (cVar1 != '-' || uStack_28._6_2_ != -0x8000)) {
      ReportError<>(this,(CStringRef)0x1dee65);
    }
    sVar4 = -uStack_28._6_2_;
    if (cVar1 != '-') {
      sVar4 = uStack_28._6_2_;
    }
    *value = sVar4;
  }
  return bVar3;
}

Assistant:

bool DoReadOptionalInt(Int &value) {
    SkipSpace();
    char sign = *ptr_;
    if (sign == '+' || sign == '-')
      ++ptr_;
    typedef typename MakeUnsigned<Int>::Type UInt;
    UInt result = 0;
    if (!ReadIntWithoutSign<UInt>(result))
      return false;
    UInt max = std::numeric_limits<Int>::max();
    if (result > max && !(sign == '-' && result == max + 1))
      ReportError("number is too big");
    value = sign != '-' ? result : 0 - result;
    return true;
  }